

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

void __thiscall fasttext::Autotune::printArgs(Autotune *this,Args *args,Args *autotuneArgs)

{
  ostream *poVar1;
  string sStack_38;
  
  if (2 < autotuneArgs->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"epoch = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,args->epoch);
    std::endl<char,std::char_traits<char>>(poVar1);
    if (2 < autotuneArgs->verbose) {
      std::operator<<((ostream *)&std::cout,"lr = ");
      poVar1 = std::ostream::_M_insert<double>(args->lr);
      std::endl<char,std::char_traits<char>>(poVar1);
      if (2 < autotuneArgs->verbose) {
        poVar1 = std::operator<<((ostream *)&std::cout,"dim = ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,args->dim);
        std::endl<char,std::char_traits<char>>(poVar1);
        if (2 < autotuneArgs->verbose) {
          poVar1 = std::operator<<((ostream *)&std::cout,"minCount = ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,args->minCount);
          std::endl<char,std::char_traits<char>>(poVar1);
          if (2 < autotuneArgs->verbose) {
            poVar1 = std::operator<<((ostream *)&std::cout,"wordNgrams = ");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,args->wordNgrams);
            std::endl<char,std::char_traits<char>>(poVar1);
            if (2 < autotuneArgs->verbose) {
              poVar1 = std::operator<<((ostream *)&std::cout,"minn = ");
              poVar1 = (ostream *)std::ostream::operator<<(poVar1,args->minn);
              std::endl<char,std::char_traits<char>>(poVar1);
              if (2 < autotuneArgs->verbose) {
                poVar1 = std::operator<<((ostream *)&std::cout,"maxn = ");
                poVar1 = (ostream *)std::ostream::operator<<(poVar1,args->maxn);
                std::endl<char,std::char_traits<char>>(poVar1);
                if (2 < autotuneArgs->verbose) {
                  poVar1 = std::operator<<((ostream *)&std::cout,"bucket = ");
                  poVar1 = (ostream *)std::ostream::operator<<(poVar1,args->bucket);
                  std::endl<char,std::char_traits<char>>(poVar1);
                  if (2 < autotuneArgs->verbose) {
                    poVar1 = std::operator<<((ostream *)&std::cout,"dsub = ");
                    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                    std::endl<char,std::char_traits<char>>(poVar1);
                    if (2 < autotuneArgs->verbose) {
                      poVar1 = std::operator<<((ostream *)&std::cout,"loss = ");
                      Args::lossToString_abi_cxx11_(&sStack_38,args,args->loss);
                      poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
                      std::endl<char,std::char_traits<char>>(poVar1);
                      std::__cxx11::string::~string((string *)&sStack_38);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Autotune::printArgs(const Args& args, const Args& autotuneArgs) {
  LOG_VAL(epoch, args.epoch)
  LOG_VAL(lr, args.lr)
  LOG_VAL(dim, args.dim)
  LOG_VAL(minCount, args.minCount)
  LOG_VAL(wordNgrams, args.wordNgrams)
  LOG_VAL(minn, args.minn)
  LOG_VAL(maxn, args.maxn)
  LOG_VAL(bucket, args.bucket)
  LOG_VAL(dsub, args.dsub)
  LOG_VAL(loss, args.lossToString(args.loss))
}